

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

_Bool array_container_iterate64
                (array_container_t *cont,uint32_t base,roaring_iterator64 iterator,
                uint64_t high_bits,void *ptr)

{
  int iVar1;
  long lVar2;
  _Bool _Var3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    iVar1 = cont->cardinality;
    if (iVar1 <= lVar4) break;
    _Var3 = (*iterator)(cont->array[lVar4] + base | high_bits,ptr);
    lVar2 = lVar4 + 1;
  } while (_Var3);
  return iVar1 <= lVar4;
}

Assistant:

bool array_container_iterate64(const array_container_t *cont, uint32_t base,
                               roaring_iterator64 iterator, uint64_t high_bits,
                               void *ptr) {
    for (int i = 0; i < cont->cardinality; i++)
        if (!iterator(high_bits | (uint64_t)(cont->array[i] + base), ptr))
            return false;
    return true;
}